

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkUnitAddition(string *unit_string,uint64_t match_flags)

{
  precise_unit pVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  unit_data local_154;
  double local_150;
  double res;
  precise_unit local_128;
  string local_118;
  precise_unit local_f8;
  string local_e8;
  precise_unit local_c8;
  string local_b8;
  precise_unit local_98;
  undefined1 local_88 [8];
  precise_unit b_unit;
  precise_unit a_unit;
  allocator local_51;
  string local_50;
  size_t local_30;
  size_t sep;
  uint64_t match_flags_local;
  string *unit_string_local;
  undefined8 local_10;
  
  sep = match_flags;
  match_flags_local = (uint64_t)unit_string;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"+",&local_51);
  sVar4 = findOperatorSep(unit_string,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((sVar4 != 0xffffffffffffffff) && (sVar4 != 0)) {
    local_30 = sVar4;
    pcVar5 = (char *)std::__cxx11::string::operator[](match_flags_local);
    sVar4 = local_30;
    if ((*pcVar5 == '+') ||
       ((lVar6 = std::__cxx11::string::size(), sVar4 == lVar6 - 1U ||
        (pcVar5 = (char *)std::__cxx11::string::operator[](match_flags_local), *pcVar5 == '+')))) {
      unit_string_local = (string *)0x7ff4000000000000;
      local_10._0_4_ = (unit_data)0xfa94a488;
      local_10._4_4_ = 0;
      goto LAB_001a9cf4;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[](match_flags_local);
    if ((*pcVar5 == 'e') ||
       (pcVar5 = (char *)std::__cxx11::string::operator[](match_flags_local), *pcVar5 == 'E')) {
      pcVar5 = (char *)std::__cxx11::string::operator[](match_flags_local);
      bVar2 = isDigitCharacter(*pcVar5);
      if ((bVar2) && (1 < local_30)) {
        pcVar5 = (char *)std::__cxx11::string::operator[](match_flags_local);
        bVar2 = isDigitCharacter(*pcVar5);
        if (bVar2) {
          unit_string_local = (string *)0x7ff4000000000000;
          local_10._0_4_ = (unit_data)0xfa94a488;
          local_10._4_4_ = 0;
          goto LAB_001a9cf4;
        }
      }
    }
    precise_unit::precise_unit((precise_unit *)&b_unit.base_units_);
    precise_unit::precise_unit((precise_unit *)local_88);
    uVar7 = local_30 + 1;
    uVar8 = std::__cxx11::string::size();
    if (uVar8 >> 1 < uVar7) {
      std::__cxx11::string::substr((ulong)&local_b8,match_flags_local);
      local_98 = unit_from_string_internal(&local_b8,sep);
      b_unit.multiplier_ = local_98._8_8_;
      local_88 = (undefined1  [8])local_98.multiplier_;
      std::__cxx11::string::~string((string *)&local_b8);
      bVar2 = is_valid((precise_unit *)local_88);
      if (!bVar2) {
        unit_string_local = (string *)0x7ff4000000000000;
        local_10._0_4_ = (unit_data)0xfa94a488;
        local_10._4_4_ = 0;
        goto LAB_001a9cf4;
      }
      std::__cxx11::string::substr((ulong)&local_e8,match_flags_local);
      local_c8 = unit_from_string_internal(&local_e8,sep);
      b_unit._8_8_ = local_c8.multiplier_;
      std::__cxx11::string::~string((string *)&local_e8);
      bVar2 = is_valid((precise_unit *)&b_unit.base_units_);
      if (!bVar2) {
        unit_string_local = (string *)0x7ff4000000000000;
        local_10._0_4_ = (unit_data)0xfa94a488;
        local_10._4_4_ = 0;
        goto LAB_001a9cf4;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_118,match_flags_local);
      local_f8 = unit_from_string_internal(&local_118,sep);
      b_unit._8_8_ = local_f8.multiplier_;
      std::__cxx11::string::~string((string *)&local_118);
      bVar2 = is_valid((precise_unit *)&b_unit.base_units_);
      if (!bVar2) {
        unit_string_local = (string *)0x7ff4000000000000;
        local_10._0_4_ = (unit_data)0xfa94a488;
        local_10._4_4_ = 0;
        goto LAB_001a9cf4;
      }
      std::__cxx11::string::substr((ulong)&res,match_flags_local);
      local_128 = unit_from_string_internal((string *)&res,sep);
      b_unit.multiplier_ = local_128._8_8_;
      local_88 = (undefined1  [8])local_128.multiplier_;
      std::__cxx11::string::~string((string *)&res);
      bVar2 = is_valid((precise_unit *)local_88);
      if (!bVar2) {
        unit_string_local = (string *)0x7ff4000000000000;
        local_10._0_4_ = (unit_data)0xfa94a488;
        local_10._4_4_ = 0;
        goto LAB_001a9cf4;
      }
    }
    local_150 = convert<units::precise_unit,units::precise_unit>
                          ((precise_unit *)local_88,(precise_unit *)&b_unit.base_units_);
    uVar3 = std::isnan(local_150);
    if ((uVar3 & 1) == 0) {
      dVar9 = precise_unit::multiplier((precise_unit *)&b_unit.base_units_);
      dVar10 = precise_unit::multiplier((precise_unit *)&b_unit.base_units_);
      dVar10 = dVar10 * local_150;
      local_154 = precise_unit::base_units((precise_unit *)&b_unit.base_units_);
      precise_unit::precise_unit((precise_unit *)&unit_string_local,dVar10 + dVar9,&local_154);
      goto LAB_001a9cf4;
    }
  }
  unit_string_local = (string *)0x7ff4000000000000;
  local_10._0_4_ = (unit_data)0xfa94a488;
  local_10._4_4_ = 0;
LAB_001a9cf4:
  pVar1.base_units_ = local_10._0_4_;
  pVar1.commodity_ = local_10._4_4_;
  pVar1.multiplier_ = (double)unit_string_local;
  return pVar1;
}

Assistant:

static precise_unit
    checkUnitAddition(const std::string& unit_string, std::uint64_t match_flags)
{
    auto sep = findOperatorSep(unit_string, "+");
    if (sep != std::string::npos && sep > 0) {
        if ((unit_string[sep - 1] == '+') || sep == unit_string.size() - 1 ||
            unit_string[sep + 1] == '+') {
            return precise::invalid;
        }
        if (unit_string[sep - 1] == 'e' || unit_string[sep - 1] == 'E') {
            // this is scientific notation not addition
            if (isDigitCharacter(unit_string[sep + 1]) &&
                (sep > 1 && isDigitCharacter(unit_string[sep - 2]))) {
                return precise::invalid;
            }
        }
        precise_unit a_unit;
        precise_unit b_unit;
        if (sep + 1 > unit_string.size() / 2) {
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
        } else {
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
        }
        auto res = convert(b_unit, a_unit);
        if (!std::isnan(res)) {
            return {
                a_unit.multiplier() + a_unit.multiplier() * res,
                a_unit.base_units()};
        }
    }
    return precise::invalid;
}